

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

uint __thiscall
ON_3dPointListRef::GetMeshNgonPoints
          (ON_3dPointListRef *this,ON_MeshNgon *mesh_ngon,ON_SimpleArray<ON_3dPoint> *ngon_points)

{
  int iVar1;
  uint uVar2;
  ulong new_capacity;
  
  if (mesh_ngon != (ON_MeshNgon *)0x0) {
    uVar2 = mesh_ngon->m_Vcount;
    new_capacity = (ulong)uVar2;
    if ((new_capacity != 0) && (mesh_ngon->m_vi != (uint *)0x0)) {
      iVar1 = ngon_points->m_capacity;
      if ((ulong)(long)iVar1 < new_capacity) {
        ON_SimpleArray<ON_3dPoint>::SetCapacity(ngon_points,new_capacity);
        uVar2 = mesh_ngon->m_Vcount;
        iVar1 = ngon_points->m_capacity;
      }
      if ((-1 < (int)uVar2) && ((int)uVar2 <= iVar1)) {
        ngon_points->m_count = uVar2;
      }
      uVar2 = GetPoints(this,uVar2,mesh_ngon->m_vi,ngon_points->m_a);
      return uVar2;
    }
  }
  if (-1 < ngon_points->m_capacity) {
    ngon_points->m_count = 0;
  }
  return 0;
}

Assistant:

unsigned int ON_3dPointListRef::GetMeshNgonPoints(
  const class ON_MeshNgon* mesh_ngon,
  ON_SimpleArray<ON_3dPoint>& ngon_points
  ) const
{
  if ( mesh_ngon && mesh_ngon->m_Vcount > 0 && 0 != mesh_ngon->m_vi )
  {
    ngon_points.Reserve(mesh_ngon->m_Vcount);
    ngon_points.SetCount(mesh_ngon->m_Vcount);
    return GetPoints(mesh_ngon->m_Vcount, mesh_ngon->m_vi, ngon_points.Array());
  }
  ngon_points.SetCount(0);
  return 0;
}